

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

_Bool read_blob(BinarySource *src,int nlines,BinarySink *bs)

{
  int iVar1;
  char *ptr;
  char *__s;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uchar decoded [3];
  uchar local_43 [3];
  BinarySource *local_40;
  ulong local_38;
  
  local_40 = src;
  if (0x1554 < nlines) {
    __assert_fail("nlines < MAX_KEY_BLOB_LINES",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x20d,"_Bool read_blob(BinarySource *, int, BinarySink *)");
  }
  uVar6 = 0;
  ptr = (char *)safemalloc((ulong)(uint)(nlines * 0x30),1,0);
  bVar3 = nlines < 1;
  if (0 < nlines) {
    do {
      __s = read_body(local_40);
      if (__s == (char *)0x0) break;
      local_38 = uVar6;
      sVar2 = strlen(__s);
      iVar4 = (int)sVar2;
      if ((0x40 < iVar4) || ((sVar2 & 3) != 0)) {
        safefree(ptr);
        ptr = __s;
        break;
      }
      if (0 < iVar4) {
        lVar7 = 0;
        do {
          iVar1 = base64_decode_atom(__s + lVar7,local_43);
          if (iVar1 == 0) {
            safefree(__s);
            safefree(ptr);
            return bVar3;
          }
          BinarySink_put_data(bs->binarysink_,local_43,(long)iVar1);
          lVar7 = lVar7 + 4;
        } while ((int)lVar7 < iVar4);
      }
      safefree(__s);
      uVar5 = (int)local_38 + 1;
      uVar6 = (ulong)uVar5;
      bVar3 = nlines <= (int)uVar5;
    } while (uVar5 != nlines);
  }
  safefree(ptr);
  return bVar3;
}

Assistant:

static bool read_blob(BinarySource *src, int nlines, BinarySink *bs)
{
    unsigned char *blob;
    char *line;
    int linelen;
    int i, j, k;

    /* We expect at most 64 base64 characters, ie 48 real bytes, per line. */
    assert(nlines < MAX_KEY_BLOB_LINES);
    blob = snewn(48 * nlines, unsigned char);

    for (i = 0; i < nlines; i++) {
        line = read_body(src);
        if (!line) {
            sfree(blob);
            return false;
        }
        linelen = strlen(line);
        if (linelen % 4 != 0 || linelen > 64) {
            sfree(blob);
            sfree(line);
            return false;
        }
        for (j = 0; j < linelen; j += 4) {
            unsigned char decoded[3];
            k = base64_decode_atom(line + j, decoded);
            if (!k) {
                sfree(line);
                sfree(blob);
                return false;
            }
            put_data(bs, decoded, k);
        }
        sfree(line);
    }
    sfree(blob);
    return true;
}